

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  unique_ptr<Catch::ColourImpl> *this_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  ulong uVar6;
  size_t *psVar7;
  ostream *poVar8;
  ulong uVar9;
  size_t passedRatio;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  size_t failedButOkRatio;
  size_t failedRatio;
  ColourGuard local_78;
  ColourImpl local_68;
  size_t skippedRatio;
  ColourGuard local_50;
  ColourGuard local_40;
  
  uVar1 = (totals->testCases).passed;
  uVar2 = (totals->testCases).failed;
  uVar3 = (totals->testCases).failedButOk;
  uVar4 = (totals->testCases).skipped;
  uVar9 = uVar2 + uVar1 + uVar3 + uVar4;
  if (uVar9 == 0) {
    poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    local_78.m_colourImpl =
         Detail::unique_ptr<Catch::ColourImpl>::operator->
                   (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
    local_78.m_code = BrightYellow;
    local_78.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_78,poVar8);
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct((ulong)local_a8,'O');
    std::operator<<(poVar8,(string *)local_a8);
  }
  else {
    uVar6 = (uVar2 * 0x50) / uVar9;
    skippedRatio = 1;
    failedRatio = uVar6;
    if (uVar2 * 0x50 < uVar9) {
      failedRatio = skippedRatio;
    }
    if (uVar2 == 0) {
      failedRatio = uVar6;
    }
    uVar6 = (uVar3 * 0x50) / uVar9;
    failedButOkRatio = uVar6;
    if (uVar3 * 0x50 < uVar9) {
      failedButOkRatio = skippedRatio;
    }
    if (uVar3 == 0) {
      failedButOkRatio = uVar6;
    }
    uVar6 = (uVar1 * 0x50) / uVar9;
    passedRatio = uVar6;
    if (uVar1 * 0x50 < uVar9) {
      passedRatio = skippedRatio;
    }
    if (uVar1 == 0) {
      passedRatio = uVar6;
    }
    uVar6 = (uVar4 * 0x50) / uVar9;
    if (uVar9 <= uVar4 * 0x50) {
      skippedRatio = uVar6;
    }
    if (uVar4 == 0) {
      skippedRatio = uVar6;
    }
    while (skippedRatio + passedRatio + failedButOkRatio + failedRatio < 0x4f) {
      psVar7 = anon_unknown_26::findMax(&failedRatio,&failedButOkRatio,&passedRatio,&skippedRatio);
      *psVar7 = *psVar7 + 1;
    }
    while (0x4f < failedButOkRatio + failedRatio + passedRatio) {
      psVar7 = anon_unknown_26::findMax(&failedRatio,&failedButOkRatio,&passedRatio,&skippedRatio);
      *psVar7 = *psVar7 - 1;
    }
    poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    this_00 = &(this->super_StreamingReporterBase).super_ReporterBase.m_colour;
    local_40.m_colourImpl = Detail::unique_ptr<Catch::ColourImpl>::operator->(this_00);
    local_40.m_code = BrightRed;
    local_40.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_40,poVar8);
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct((ulong)local_a8,(char)failedRatio);
    poVar8 = std::operator<<(poVar8,(string *)local_a8);
    local_50.m_colourImpl = Detail::unique_ptr<Catch::ColourImpl>::operator->(this_00);
    local_50.m_code = BrightYellow;
    local_50.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_50,poVar8);
    local_78.m_colourImpl = &local_68;
    std::__cxx11::string::_M_construct((ulong)&local_78,(char)failedButOkRatio);
    std::operator<<(poVar8,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    ColourImpl::ColourGuard::~ColourGuard(&local_50);
    std::__cxx11::string::~string((string *)local_a8);
    ColourImpl::ColourGuard::~ColourGuard(&local_40);
    bVar5 = Counts::allPassed(&totals->testCases);
    poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    if (bVar5) {
      local_78.m_colourImpl = Detail::unique_ptr<Catch::ColourImpl>::operator->(this_00);
      local_78.m_code = BrightGreen;
      local_78.m_engaged = false;
      ColourImpl::ColourGuard::engageImpl(&local_78,poVar8);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)passedRatio);
      std::operator<<(poVar8,(string *)local_a8);
    }
    else {
      local_78.m_colourImpl = Detail::unique_ptr<Catch::ColourImpl>::operator->(this_00);
      local_78.m_code = Green;
      local_78.m_engaged = false;
      ColourImpl::ColourGuard::engageImpl(&local_78,poVar8);
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct((ulong)local_a8,(char)passedRatio);
      std::operator<<(poVar8,(string *)local_a8);
    }
    std::__cxx11::string::~string((string *)local_a8);
    ColourImpl::ColourGuard::~ColourGuard(&local_78);
    poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    local_78.m_colourImpl = Detail::unique_ptr<Catch::ColourImpl>::operator->(this_00);
    local_78.m_code = FileName;
    local_78.m_engaged = false;
    ColourImpl::ColourGuard::engageImpl(&local_78,poVar8);
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct((ulong)local_a8,(char)skippedRatio);
    std::operator<<(poVar8,(string *)local_a8);
  }
  std::__cxx11::string::~string((string *)local_a8);
  ColourImpl::ColourGuard::~ColourGuard(&local_78);
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,'\n');
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        std::size_t skippedRatio = makeRatio(totals.testCases.skipped, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio + skippedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)--;

        m_stream << m_colour->guardColour( Colour::Error )
                 << std::string( failedRatio, '=' )
                 << m_colour->guardColour( Colour::ResultExpectedFailure )
                 << std::string( failedButOkRatio, '=' );
        if ( totals.testCases.allPassed() ) {
            m_stream << m_colour->guardColour( Colour::ResultSuccess )
                     << std::string( passedRatio, '=' );
        } else {
            m_stream << m_colour->guardColour( Colour::Success )
                     << std::string( passedRatio, '=' );
        }
        m_stream << m_colour->guardColour( Colour::Skip )
                 << std::string( skippedRatio, '=' );
    } else {
        m_stream << m_colour->guardColour( Colour::Warning )
                 << std::string( CATCH_CONFIG_CONSOLE_WIDTH - 1, '=' );
    }
    m_stream << '\n';
}